

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbox.cpp
# Opt level: O0

void __thiscall ftxui::VBox::SetBox(VBox *this,Box box)

{
  int iVar1;
  value_type *pvVar2;
  size_type sVar3;
  value_type *pvVar4;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  reference pvVar7;
  ulong local_c0;
  size_t i_1;
  int y;
  int target_size;
  int local_a0;
  int local_98;
  int *local_80;
  Requirement *requirement;
  value_type *element;
  size_t i;
  allocator<ftxui::box_helper::Element> local_51;
  undefined1 local_50 [8];
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> elements;
  VBox *this_local;
  Box box_local;
  
  elements.
  super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  sVar3 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ::size(&(this->super_Node).children_);
  std::allocator<ftxui::box_helper::Element>::allocator(&local_51);
  std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::vector
            ((vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> *)
             local_50,sVar3,&local_51);
  std::allocator<ftxui::box_helper::Element>::~allocator(&local_51);
  element = (value_type *)0x0;
  while( true ) {
    pvVar2 = element;
    pvVar4 = (value_type *)
             std::
             vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
             size(&(this->super_Node).children_);
    if (pvVar4 <= pvVar2) break;
    requirement = (Requirement *)
                  std::
                  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::
                  operator[]((vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                              *)local_50,(size_type)element);
    p_Var5 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
             operator[](&(this->super_Node).children_,(size_type)element);
    peVar6 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    Node::requirement((Requirement *)&y,peVar6);
    local_80 = &y;
    requirement->min_x = target_size;
    requirement->min_y = local_a0;
    requirement->flex_grow_x = local_98;
    element = (value_type *)((long)&element->min_size + 1);
  }
  box_local.x_min = box.y_min;
  box_local.x_max = box.y_max;
  box_helper::Compute((vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                       *)local_50,(box_local.x_max - box_local.x_min) + 1);
  i_1._4_4_ = box_local.x_min;
  local_c0 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
            size(&(this->super_Node).children_);
    if (sVar3 <= local_c0) break;
    pvVar7 = std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::
             operator[]((vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                         *)local_50,local_c0);
    iVar1 = i_1._4_4_ + -1 + pvVar7->size;
    p_Var5 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
             operator[](&(this->super_Node).children_,local_c0);
    peVar6 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    (*peVar6->_vptr_Node[3])(peVar6,box._0_8_,CONCAT44(iVar1,i_1._4_4_));
    i_1._4_4_ = iVar1 + 1;
    local_c0 = local_c0 + 1;
  }
  std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::~vector
            ((vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> *)
             local_50);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    std::vector<box_helper::Element> elements(children_.size());
    for (size_t i = 0; i < children_.size(); ++i) {
      auto& element = elements[i];
      const auto& requirement = children_[i]->requirement();
      element.min_size = requirement.min_y;
      element.flex_grow = requirement.flex_grow_y;
      element.flex_shrink = requirement.flex_shrink_y;
    }
    int target_size = box.y_max - box.y_min + 1;
    box_helper::Compute(&elements, target_size);

    int y = box.y_min;
    for (size_t i = 0; i < children_.size(); ++i) {
      box.y_min = y;
      box.y_max = y + elements[i].size - 1;
      children_[i]->SetBox(box);
      y = box.y_max + 1;
    }
  }